

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O3

void __thiscall ExtraData::printExtraData(ExtraData *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pSVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  long *plVar10;
  ulong uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_00;
  long lVar12;
  ExtraData *this_00;
  pointer puVar13;
  ulong uVar14;
  ulong uVar15;
  string local_6a0;
  ulong local_680;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_678;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_660;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_648;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_630;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_618;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_600;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_588;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_570;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_558;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_540;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_528;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_510;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_480;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_468;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_420;
  TypedPropertyValue local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_390;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_360;
  void *local_348 [2];
  long local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_330;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_318;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_300;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  void *local_2a0 [2];
  long local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_270;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_______________________ExtraData_________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (this->consolePropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CONSOLE_PROP: ",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    Utils::lenFourBytes(&local_48);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 204.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_60,&(this->CONSOLE_PROPS).BlockSignature);
    Utils::print_vec(&local_60);
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000002.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   FillAttributes:                  ",0x24);
    parseFillAttributes(this,false);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   PopupFillAttributes:             ",0x24);
    parseFillAttributes(this,true);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   ScreenBufferSizeX:               ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_78,&(this->CONSOLE_PROPS).ScreenBufferSizeX);
    iVar7 = Utils::lenTwoBytes(&local_78);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," characters",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   ScreenBufferSizeY:               ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_90,&(this->CONSOLE_PROPS).ScreenBufferSizeY);
    iVar7 = Utils::lenTwoBytes(&local_90);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," characters",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   WindowSizeX:                     ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_a8,&(this->CONSOLE_PROPS).WindowSizeX);
    iVar7 = Utils::lenTwoBytes(&local_a8);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," characters",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   WindowSizeY:                     ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_c0,&(this->CONSOLE_PROPS).WindowSizeY);
    iVar7 = Utils::lenTwoBytes(&local_c0);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," characters",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   WindowOriginX:                   ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_d8,&(this->CONSOLE_PROPS).WindowOriginX);
    iVar7 = Utils::lenTwoBytes(&local_d8);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," pixels",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   WindowOriginY:                   ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_f0,&(this->CONSOLE_PROPS).WindowOriginY);
    iVar7 = Utils::lenTwoBytes(&local_f0);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," pixels",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   UNUSED1:                         ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_108,&(this->CONSOLE_PROPS).UNUSED1);
    Utils::print_vec(&local_108);
    if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"A value that is undefined and MUST be ignored.",0x2e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   UNUSED2:                         ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_120,&(this->CONSOLE_PROPS).UNUSED2);
    Utils::print_vec(&local_120);
    if (local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"A value that is undefined and MUST be ignored.",0x2e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   FontSize:                        ",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    puVar13 = (this->CONSOLE_PROPS).FontSize.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar8 = *puVar13;
    uVar2 = puVar13[1];
    uVar3 = puVar13[2];
    uVar4 = puVar13[3];
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"       Font height:                 ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar8 << 8 | uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," pixels",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"       Font width:                  ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3 << 8 | uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," pixels",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   FontFamily:                      ",0x24);
    parseFontFamily(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   FontWeight:                      ",0x24);
    parseFontWeight(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   FaceName:                        ",0x24);
    Utils::print_vec_unicode(&(this->CONSOLE_PROPS).FaceName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   CursorSize:                      ",0x24);
    parseCursorSize(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   FullScreen:                      ",0x24);
    parseFullScreen(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   QuickEdit:                       ",0x24);
    parseQuickEdit(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   InsertMode:                      ",0x24);
    parseInsertMode(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   AutoPosition:                    ",0x24);
    parseAutoPosition(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   HistoryBufferSize:               ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_138,&(this->CONSOLE_PROPS).HistoryBufferSize);
    Utils::lenFourBytes(&local_138);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," characters",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   NumberOfHistoryBuffers:          ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_150,&(this->CONSOLE_PROPS).NumberOfHistoryBuffers);
    Utils::lenFourBytes(&local_150);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_150.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   HistoryNoDup:                    ",0x24);
    parseHistoryNoDup(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   ColorTable:                      ",0x24);
    parseColorTable(this);
  }
  if (this->consoleFEIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CONSOLE_FE_PROPS: ",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_168,&(this->CONSOLE_FE_PROPS).BlockSize);
    Utils::lenFourBytes(&local_168);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 12.",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_180,&(this->CONSOLE_FE_PROPS).BlockSignature);
    Utils::print_vec(&local_180);
    if (local_180.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000004.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   CodePage:                        ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_198,&(this->CONSOLE_FE_PROPS).CodePage);
    Utils::print_vec(&local_198);
    if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (this->drownPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DARWIN_PROPS: ",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1b0,&(this->DARWIN_PROPS).BlockSize);
    Utils::lenFourBytes(&local_1b0);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 788.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_1b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1c8,&(this->DARWIN_PROPS).BlockSignature);
    Utils::print_vec(&local_1c8);
    if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000006.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   DarwinDataAnsi:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1e0,&(this->DARWIN_PROPS).DarwinDataAnsi);
    Utils::print_vec(&local_1e0);
    if (local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   DarwinDataUnicode:               ",0x24);
    Utils::print_vec_unicode(&(this->DARWIN_PROPS).DarwinDataUnicode);
  }
  if (this->environmentPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ENVIRONMENT_PROPS: ",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1f8,&(this->ENVIRONMENT_PROPS).BlockSize);
    Utils::lenFourBytes(&local_1f8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 788.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_210,&(this->ENVIRONMENT_PROPS).BlockSignature);
    Utils::print_vec(&local_210);
    if (local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_210.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000001.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   TargetAnsi:                      ",0x24);
    Utils::print_vec_unicode(&(this->ENVIRONMENT_PROPS).TargetAnsi);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   TargetUnicode:                   ",0x24);
    Utils::print_vec_unicode(&(this->ENVIRONMENT_PROPS).TargetUnicode);
  }
  if (this->iconEnvironmentPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ICON_ENVIRONMENT_PROPS: ",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_228,&(this->ICON_ENVIRONMENT_PROPS).BlockSize);
    Utils::lenFourBytes(&local_228);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 788.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_240,&(this->ICON_ENVIRONMENT_PROPS).BlockSignature);
    Utils::print_vec(&local_240);
    if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_240.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_240.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000007.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   TargetAnsi:                      ",0x24);
    Utils::print_vec_unicode(&(this->ICON_ENVIRONMENT_PROPS).TargetAnsi);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   TargetUnicode:                   ",0x24);
    Utils::print_vec_unicode(&(this->ICON_ENVIRONMENT_PROPS).TargetUnicode);
  }
  if (this->knownFolderPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"KNOWN_FOLDER_PROPS: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_258,&(this->KNOWN_FOLDER_PROPS).BlockSize);
    Utils::lenFourBytes(&local_258);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 28.",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_270,&(this->KNOWN_FOLDER_PROPS).BlockSignature);
    Utils::print_vec(&local_270);
    if (local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_270.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_270.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA000000B.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   KnownFolderID:                   ",0x24);
    pvVar1 = &(this->KNOWN_FOLDER_PROPS).KnownFolderID;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_288,pvVar1);
    Utils::printSid(&local_288,0);
    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,pvVar1);
    Utils::getClsidType_abi_cxx11_(&local_6a0,(Utils *)local_2a0,vec);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_6a0._M_dataplus._M_p,local_6a0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0[0] != (void *)0x0) {
      operator_delete(local_2a0[0],local_290 - (long)local_2a0[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Offset:                          ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_2b8,&(this->KNOWN_FOLDER_PROPS).Offset);
    Utils::lenFourBytes(&local_2b8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes.",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "Specifies the location of the ItemID of the first child segment of the IDList specified by KnownFolderID. "
               ,0x6a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"This value is the offset, in bytes, into the link target IDList.",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (this->propertyStorePropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PROPERTY_STORE_PROPS: ",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_2d0,&(this->PROPERTY_STORE_PROPS).BlockSize);
    Utils::lenFourBytes(&local_2d0);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"This value MUST be greater than or equal to 12.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_2d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_2e8,&(this->PROPERTY_STORE_PROPS).BlockSignature);
    Utils::print_vec(&local_2e8);
    if (local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000009.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   PropertyStore:                   ",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if ((this->PROPERTY_STORE_PROPS).PropertyStore.
        super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->PROPERTY_STORE_PROPS).PropertyStore.
        super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   Serialized Property Storage ",0x1f);
        uVar14 = uVar15 + 1;
        plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar14);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"          StorageSize:              ",0x24);
        *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_300,
                   &(this->PROPERTY_STORE_PROPS).PropertyStore.
                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].StorageSize);
        Utils::lenFourBytes(&local_300);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (local_300.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_300.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_300.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"          Version:                  ",0x24);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_318,
                   &(this->PROPERTY_STORE_PROPS).PropertyStore.
                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].Version);
        Utils::print_vec(&local_318);
        if (local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_318.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_318.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_318.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                            Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Has to be equal to 0x53505331.",0x1e);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"          FormatID:                 ",0x24);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_330,
                   &(this->PROPERTY_STORE_PROPS).PropertyStore.
                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].FormatID);
        Utils::printSid(&local_330,0);
        if (local_330.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_330.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_330.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348,
                   &(this->PROPERTY_STORE_PROPS).PropertyStore.
                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].FormatID);
        Utils::getClsidType_abi_cxx11_(&local_6a0,(Utils *)local_348,vec_00);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_6a0._M_dataplus._M_p,
                            local_6a0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        local_680 = uVar14;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        if (local_348[0] != (void *)0x0) {
          operator_delete(local_348[0],local_338 - (long)local_348[0]);
        }
        pSVar5 = (this->PROPERTY_STORE_PROPS).PropertyStore.
                 super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pSVar5[uVar15].SerializedPropertyValue.
                     super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                     ._M_impl + 8) !=
            pSVar5[uVar15].SerializedPropertyValue.
            super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar12 = 0x90;
          uVar14 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"          SerializedPropertyValue ",0x22);
            uVar14 = uVar14 + 1;
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"            ValueSize:              ",0x24);
            *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_360,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                  SerializedPropertyValue.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                  ._M_impl.super__Vector_impl_data + lVar12 + -0x90));
            Utils::lenFourBytes(&local_360);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if (local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_360.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_360.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_360.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (this->isStringNameStructInPropsStorage == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"            NameSize:               ",0x24);
              *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_378,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                    SerializedPropertyValue.
                                    super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                    ._M_impl.super__Vector_impl_data + lVar12 + -0x78));
              Utils::lenFourBytes(&local_378);
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              pvVar1 = &local_378;
              puVar13 = local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"            Id:                     ",0x24);
              *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_390,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                    SerializedPropertyValue.
                                    super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                    ._M_impl.super__Vector_impl_data + lVar12 + -0x78));
              Utils::lenFourBytes(&local_390);
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              pvVar1 = &local_390;
              puVar13 = local_390.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
            if (puVar13 != (pointer)0x0) {
              operator_delete(puVar13,(long)(pvVar1->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)puVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"            Reserved:               ",0x24);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_3a8,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                  SerializedPropertyValue.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                  ._M_impl.super__Vector_impl_data + lVar12 + -0x60));
            Utils::print_vec(&local_3a8);
            if (local_3a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3a8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_3a8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,
                                Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                                Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"MUST be 0x00.",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if (this->isStringNameStructInPropsStorage == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"            Name:               ",0x20);
              Utils::print_vec_unicode
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                    SerializedPropertyValue.
                                    super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                    ._M_impl.super__Vector_impl_data + lVar12 + -0x48));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"            Value (TypedPropertyValue structure):",
                       0x31);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
            std::ostream::put('(');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"              Type:                 ",0x24);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_3c0,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                  SerializedPropertyValue.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                  ._M_impl.super__Vector_impl_data + lVar12 + -0x30));
            uVar8 = Utils::vectTwoToUnsignedInt(&local_3c0,0);
            lVar6 = *(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15].
                              SerializedPropertyValue.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                              ._M_impl.super__Vector_impl_data;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_408.Type,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (lVar6 + lVar12 + -0x30));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_408.Padding,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (lVar6 + lVar12 + -0x18));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_408.Value,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar6 + lVar12));
            parseTypedPropertyValueTypeAndValue(this,true,uVar8,&local_408);
            if (local_408.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_408.Value.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_408.Value.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_408.Value.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_408.Padding.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_408.Padding.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_408.Padding.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_408.Padding.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_408.Type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_408.Type.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_408.Type.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_408.Type.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_3c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_3c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"              Padding:              ",0x24);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_420,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                  SerializedPropertyValue.
                                  super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                  ._M_impl.super__Vector_impl_data + lVar12 + -0x18));
            Utils::print_vec(&local_420);
            if (local_420.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_420.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_420.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_420.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,
                                Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                                Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"MUST be set to zero, and any nonzero value SHOULD be rejected.",0x3e)
            ;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pSVar5 = (this->PROPERTY_STORE_PROPS).PropertyStore.
                     super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = ((long)*(pointer *)
                             ((long)&pSVar5[uVar15].SerializedPropertyValue.
                                     super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                     ._M_impl + 8) -
                      *(long *)&pSVar5[uVar15].SerializedPropertyValue.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                ._M_impl.super__Vector_impl_data >> 3) * -0x30c30c30c30c30c3;
            lVar12 = lVar12 + 0xa8;
          } while (uVar14 <= uVar11 && uVar11 - uVar14 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"          TerminalIdentifier:       ",0x24);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_438,
                   &(this->PROPERTY_STORE_PROPS).PropertyStore.
                    super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].TerminalIdentifier);
        Utils::print_vec(&local_438);
        uVar15 = local_680;
        if (local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_438.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_438.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar14 = ((long)(this->PROPERTY_STORE_PROPS).PropertyStore.
                        super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->PROPERTY_STORE_PROPS).PropertyStore.
                        super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      } while (uVar15 <= uVar14 && uVar14 - uVar15 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   TerminalId:                      ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_450,&(this->PROPERTY_STORE_PROPS).TerminalId);
    Utils::print_vec(&local_450);
    if (local_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_450.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (this->shimPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SHIM_PROPS: ",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_468,&(this->SHIM_PROPS).BlockSize);
    Utils::lenFourBytes(&local_468);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"This value MUST be greater than or equal to 136.",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_468.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_468.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_480,&(this->SHIM_PROPS).BlockSignature);
    Utils::print_vec(&local_480);
    if (local_480.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_480.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_480.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_480.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000008.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   LayerName:                       ",0x24);
    Utils::print_vec_unicode(&(this->SHIM_PROPS).LayerName);
  }
  if (this->sFolderPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SPECIAL_FOLDER_PROPS: ",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_498,&(this->SPECIAL_FOLDER_PROPS).BlockSize);
    Utils::lenFourBytes(&local_498);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 16.",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_498.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_4b0,&(this->SPECIAL_FOLDER_PROPS).BlockSignature);
    Utils::print_vec(&local_4b0);
    if (local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000005.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   SpecialFolderID:                 ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    pvVar1 = &(this->SPECIAL_FOLDER_PROPS).SpecialFolderID;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4c8,pvVar1);
    Utils::lenFourBytes(&local_4c8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," : ",3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_678,pvVar1);
    this_00 = (ExtraData *)0x0;
    uVar8 = Utils::vectFourBytesToUnsignedInt(&local_678,0);
    getSpecialFolderType_abi_cxx11_(&local_6a0,this_00,uVar8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_6a0._M_dataplus._M_p,local_6a0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if (local_678.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_678.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_678.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_678.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Offset:                          ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_4e0,&(this->SPECIAL_FOLDER_PROPS).Offset);
    Utils::lenFourBytes(&local_4e0);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes.",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "Specifies the location of the ItemID of the first child segment of the IDList specified by SpecialFolderID. "
               ,0x6c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"This value is the offset, in bytes, into the link target IDList.",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_4e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (this->trackerPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TRACKER_PROPS: ",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_4f8,&(this->TRACKER_PROPS).BlockSize);
    Utils::lenFourBytes(&local_4f8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 96.",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_510,&(this->TRACKER_PROPS).BlockSignature);
    Utils::print_vec(&local_510);
    if (local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_510.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_510.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA0000003.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Length:                          ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_528,&(this->TRACKER_PROPS).Length);
    Utils::lenFourBytes(&local_528);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 88 bytes.",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_528.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_528.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Version:                         ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_540,&(this->TRACKER_PROPS).Version);
    Utils::lenFourBytes(&local_540);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_540.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_540.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_540.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_540.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0.",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   MachineID (NetBIOS name):        ",0x24);
    Utils::print_vec_unicode(&(this->TRACKER_PROPS).MachineID);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Droid:                           ",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"     Droid volume identifier:       ",0x24);
    pvVar1 = &(this->TRACKER_PROPS).Droid;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_558,pvVar1);
    Utils::printSid(&local_558,0x10);
    if (local_558.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_558.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_558.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_558.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"     Droid file identifier:         ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_570,pvVar1);
    Utils::printSid(&local_570,0);
    if (local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_570.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_570.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"     UUID Sequence number:          ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_588,pvVar1);
    Utils::vectTwoToUnsignedInt(&local_588,0x18);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_588.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_588.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"     Mac address:                   ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5a0,pvVar1);
    Utils::printMacAddr(&local_5a0,0x10);
    if (local_5a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5a0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5a0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   DroidBirth:                      ",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"     Birth droid volume identifier: ",0x24);
    pvVar1 = &(this->TRACKER_PROPS).DroidBirth;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5b8,pvVar1);
    Utils::printSid(&local_5b8,0x10);
    if (local_5b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"     Birth droid file identifier:   ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5d0,pvVar1);
    Utils::printSid(&local_5d0,0);
    if (local_5d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  if (this->vistaAndAboveIDListPropsIsSet == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"VISTA_AND_ABOVE_IDLIST_PROPS: ",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSize:                       ",0x24);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_5e8,&(this->VISTA_AND_ABOVE_IDLIST_PROPS).BlockSize);
    Utils::lenFourBytes(&local_5e8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"This value MUST be greater than or equal to 10.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (local_5e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   BlockSignature:                  ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_600,&(this->VISTA_AND_ABOVE_IDLIST_PROPS).BlockSignature);
    Utils::print_vec(&local_600);
    if (local_600.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_600.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_600.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_600.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"This value MUST be 0xA000000C.",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   IDList: ",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if ((this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
        super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
        super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar12 = 0x18;
      uVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"       ItemID ",0xe);
        uVar15 = uVar15 + 1;
        plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar15);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"           ItemIDSize:              ",0x24);
        *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_618,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                          super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar12 + -0x18));
        iVar7 = Utils::lenTwoBytes(&local_618);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (local_618.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_618.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_618.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_618.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"           Data:                    ",0x24);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_630,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(((this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                             super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                             ._M_impl.super__Vector_impl_data._M_start)->ItemIDSize).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                   lVar12));
        Utils::parseItemData(&local_630);
        if (local_630.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_630.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_630.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_630.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar14 = ((long)(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                        super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                        super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        lVar12 = lVar12 + 0x30;
      } while (uVar15 <= uVar14 && uVar14 - uVar15 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"           TerminalID:              ",0x24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_648,&(this->VISTA_AND_ABOVE_IDLIST_PROPS).TerminalID);
    Utils::print_vec(&local_648);
    if (local_648.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_648.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_648.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_648.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TerminalBlock:                      ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_660,&this->TerminalBlock);
  Utils::print_vec(&local_660);
  if (local_660.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_660.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_660.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_660.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_________________________________________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void ExtraData::printExtraData() {
    cout << "_______________________ExtraData_________________________" << endl;

    if (consolePropsIsSet) {
        /* CONSOLE_PROPS struct*/
        cout << "CONSOLE_PROP: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(CONSOLE_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 204." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(CONSOLE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000002." << endl;
        cout << "   FillAttributes:                  "; ExtraData::parseFillAttributes(false); cout << endl;
        cout << "   PopupFillAttributes:             "; ExtraData::parseFillAttributes(true); cout << endl;
        cout << "   ScreenBufferSizeX:               " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.ScreenBufferSizeX) << " characters" << endl;
        cout << "   ScreenBufferSizeY:               " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.ScreenBufferSizeY) << " characters" << endl;
        cout << "   WindowSizeX:                     " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowSizeX) << " characters" << endl;
        cout << "   WindowSizeY:                     " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowSizeY) << " characters" << endl;
        cout << "   WindowOriginX:                   " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowOriginX) << " pixels" << endl;
        cout << "   WindowOriginY:                   " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowOriginY) << " pixels" << endl;
        cout << "   UNUSED1:                         "; Utils::print_vec(CONSOLE_PROPS.UNUSED1);
            cout << Utils::defaultOffsetDocInfo << "A value that is undefined and MUST be ignored." << endl;
        cout << "   UNUSED2:                         "; Utils::print_vec(CONSOLE_PROPS.UNUSED2);
            cout << Utils::defaultOffsetDocInfo << "A value that is undefined and MUST be ignored." << endl;
       cout << "   FontSize:                        " << endl;
            int height  = ((CONSOLE_PROPS.FontSize[0] << 8) | CONSOLE_PROPS.FontSize[1]);
            int width = ((CONSOLE_PROPS.FontSize[2] << 8) | CONSOLE_PROPS.FontSize[3]);
            cout << "       Font height:                 " << dec << height << " pixels" << endl;
            cout << "       Font width:                  " << dec << width << " pixels" << endl;
        cout << "   FontFamily:                      "; ExtraData::parseFontFamily();
        cout << "   FontWeight:                      "; ExtraData::parseFontWeight();
        cout << "   FaceName:                        "; Utils::print_vec_unicode(CONSOLE_PROPS.FaceName);
        cout << "   CursorSize:                      "; ExtraData::parseCursorSize();
        cout << "   FullScreen:                      "; ExtraData::parseFullScreen();
        cout << "   QuickEdit:                       "; ExtraData::parseQuickEdit();
        cout << "   InsertMode:                      "; ExtraData::parseInsertMode();
        cout << "   AutoPosition:                    "; ExtraData::parseAutoPosition();
        cout << "   HistoryBufferSize:               " << dec << Utils::lenFourBytes(CONSOLE_PROPS.HistoryBufferSize) << " characters" << endl;
        cout << "   NumberOfHistoryBuffers:          " << dec << Utils::lenFourBytes(CONSOLE_PROPS.NumberOfHistoryBuffers) << endl;
        cout << "   HistoryNoDup:                    "; ExtraData::parseHistoryNoDup();
        // Сделан просто вывод в hex формате без перевода в название цвета (не понятно, почему 16 записеё и по 4 байта)
        cout << "   ColorTable:                      "; ExtraData::parseColorTable();
    }
    if (consoleFEIsSet) {
        /* CONSOLE_FE_PROPS struct*/
        cout << "CONSOLE_FE_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(CONSOLE_FE_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 12." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(CONSOLE_FE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000004." << endl;
        cout << "   CodePage:                        "; Utils::print_vec(CONSOLE_FE_PROPS.CodePage);
    }
    if (drownPropsIsSet) {
        /* DARWIN_PROPS struct*/
        cout << "DARWIN_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(DARWIN_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(DARWIN_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000006." << endl;
        cout << "   DarwinDataAnsi:                  "; Utils::print_vec(DARWIN_PROPS.DarwinDataAnsi);
        cout << "   DarwinDataUnicode:               "; Utils::print_vec_unicode(DARWIN_PROPS.DarwinDataUnicode);
    }
    if (environmentPropsIsSet) {
        /* ENVIRONMENT_PROPS struct*/
        cout << "ENVIRONMENT_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(ENVIRONMENT_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(ENVIRONMENT_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000001." << endl;
        cout << "   TargetAnsi:                      "; Utils::print_vec_unicode(ENVIRONMENT_PROPS.TargetAnsi);
        cout << "   TargetUnicode:                   "; Utils::print_vec_unicode(ENVIRONMENT_PROPS.TargetUnicode);
    }
    if (iconEnvironmentPropsIsSet) { // Проверена
        /* ICON_ENVIRONMENT_PROPS struct*/
        cout << "ICON_ENVIRONMENT_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(ICON_ENVIRONMENT_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(ICON_ENVIRONMENT_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000007." << endl;
        cout << "   TargetAnsi:                      "; Utils::print_vec_unicode(ICON_ENVIRONMENT_PROPS.TargetAnsi);
        cout << "   TargetUnicode:                   "; Utils::print_vec_unicode(ICON_ENVIRONMENT_PROPS.TargetUnicode);
    }
    if (knownFolderPropsIsSet) { //Проверена
        /* KNOWN_FOLDER_PROPS struct*/
        cout << "KNOWN_FOLDER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(KNOWN_FOLDER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 28." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(KNOWN_FOLDER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA000000B." << endl;
        cout << "   KnownFolderID:                   "; Utils::printSid(KNOWN_FOLDER_PROPS.KnownFolderID, 0);
            cout << " : " << Utils::getClsidType(KNOWN_FOLDER_PROPS.KnownFolderID) << endl;
        cout << "   Offset:                          " << dec << Utils::lenFourBytes(KNOWN_FOLDER_PROPS.Offset) << " bytes." << endl <<
            Utils::defaultOffsetDocInfo << "Specifies the location of the ItemID of the first child segment of the IDList specified by KnownFolderID. " << endl <<
            Utils::defaultOffsetDocInfo << "This value is the offset, in bytes, into the link target IDList." << endl;
    }
    if (propertyStorePropsIsSet) {
        /* PROPERTY_STORE_PROPS struct*/
        cout << "PROPERTY_STORE_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(PROPERTY_STORE_PROPS.BlockSize) << " bytes" << endl <<
        Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 12." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(PROPERTY_STORE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000009." << endl;
        cout << "   PropertyStore:                   " << endl;
        for (int j = 0; j < PROPERTY_STORE_PROPS.PropertyStore.size(); ++j) {
            cout << "   Serialized Property Storage " << j+1 << endl;
            cout << "          StorageSize:              " << dec << Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].StorageSize)
                 << " bytes" << endl;
            cout << "          Version:                  "; Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].Version);
            cout << Utils::defaultOffsetDocInfo << "Has to be equal to 0x53505331." << endl;
            cout << "          FormatID:                 ";  Utils::printSid(PROPERTY_STORE_PROPS.PropertyStore[j].FormatID, 0);
            cout << " : " << Utils::getClsidType(PROPERTY_STORE_PROPS.PropertyStore[j].FormatID) << endl;

            for (int i = 0; i < PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue.size(); ++i) {
                cout << "          SerializedPropertyValue " << i + 1 << ":" << endl;
                cout << "            ValueSize:              " << dec <<
                     Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].ValueSize)  << " bytes" << endl;
                if (isStringNameStructInPropsStorage) {
                    /* for StringName */
                    cout << "            NameSize:               "  << dec <<
                         Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].NameSizeOrId) << " bytes" << endl;
                } else {
                    /* for IntegerName */
                    cout << "            Id:                     " << dec <<
                         Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].NameSizeOrId) << endl;
                }
                cout << "            Reserved:               ";
                Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Reserved);
                    cout << Utils::defaultOffsetDocInfo << "MUST be 0x00." << endl;
                if (isStringNameStructInPropsStorage) {
                    /* for StringName */
                    cout << "            Name:               ";
                    Utils::print_vec_unicode(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Name);
                }
                cout << "            Value (TypedPropertyValue structure):" << endl;
                cout << "              Type:                 ";
                ExtraData::parseTypedPropertyValueTypeAndValue(true, Utils::vectTwoToUnsignedInt(
                                                    PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value.Type, 0),
                                                    PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value);
                cout << "              Padding:              ";
                Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value.Padding);
                cout << Utils::defaultOffsetDocInfo << "MUST be set to zero, and any nonzero value SHOULD be rejected." << endl;
            }
            cout << "          TerminalIdentifier:       ";
            Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].TerminalIdentifier);
        }
        cout << "   TerminalId:                      "; Utils::print_vec(PROPERTY_STORE_PROPS.TerminalId);
    }
    if (shimPropsIsSet) {
        /* SHIM_PROPS struct*/
        cout << "SHIM_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(SHIM_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 136." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(SHIM_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000008." << endl;
        cout << "   LayerName:                       "; Utils::print_vec_unicode(SHIM_PROPS.LayerName);
    }
    if (sFolderPropsIsSet) { // Проверена
        /* SPECIAL_FOLDER_PROPS struct*/
        cout << "SPECIAL_FOLDER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 16." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(SPECIAL_FOLDER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000005." << endl;
        cout << "   SpecialFolderID:                 " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.SpecialFolderID) <<  " : " <<
            ExtraData::getSpecialFolderType(Utils::vectFourBytesToUnsignedInt(SPECIAL_FOLDER_PROPS.SpecialFolderID, 0)) << endl;
        cout << "   Offset:                          " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.Offset) << " bytes." << endl <<
            Utils::defaultOffsetDocInfo << "Specifies the location of the ItemID of the first child segment of the IDList specified by SpecialFolderID. " << endl <<
            Utils::defaultOffsetDocInfo << "This value is the offset, in bytes, into the link target IDList." << endl;
    }
    if (trackerPropsIsSet) {
        /* TRACKER_PROPS struct*/
        cout << "TRACKER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(TRACKER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 96." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(TRACKER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000003." << endl;
        cout << "   Length:                          "  << dec << Utils::lenFourBytes(TRACKER_PROPS.Length) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 88 bytes." << endl;
        cout << "   Version:                         " << dec << Utils::lenFourBytes(TRACKER_PROPS.Version) << endl;
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0." << endl;
        cout << "   MachineID (NetBIOS name):        "; Utils::print_vec_unicode(TRACKER_PROPS.MachineID);
        cout << "   Droid:                           " << endl;
        cout << "     Droid volume identifier:       "; Utils::printSid(TRACKER_PROPS.Droid, 16); cout << endl;
        cout << "     Droid file identifier:         "; Utils::printSid(TRACKER_PROPS.Droid, 0); cout << endl;
        cout << "     UUID Sequence number:          " << dec << Utils::vectTwoToUnsignedInt(TRACKER_PROPS.Droid, 24) << endl;
        cout << "     Mac address:                   "; Utils::printMacAddr(TRACKER_PROPS.Droid, 16);
        cout << "   DroidBirth:                      " << endl;
        cout << "     Birth droid volume identifier: "; Utils::printSid(TRACKER_PROPS.DroidBirth, 16); cout << endl;
        cout << "     Birth droid file identifier:   "; Utils::printSid(TRACKER_PROPS.DroidBirth, 0); cout << endl;
    }
    if (vistaAndAboveIDListPropsIsSet) {
        /* VISTA_AND_ABOVE_IDLIST_PROPS struct*/
        cout << "VISTA_AND_ABOVE_IDLIST_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec
            << Utils::lenFourBytes(VISTA_AND_ABOVE_IDLIST_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 10." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(VISTA_AND_ABOVE_IDLIST_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA000000C." << endl;
        cout << "   IDList: " <<  endl;
        for(int i = 0; i < VISTA_AND_ABOVE_IDLIST_PROPS.IDList.size(); ++i){
            cout << "       ItemID " << i + 1 << endl;
            cout << "           ItemIDSize:              " << dec
                 << Utils::lenTwoBytes(VISTA_AND_ABOVE_IDLIST_PROPS.IDList[i].ItemIDSize) << " bytes" << endl;
            cout << "           Data:                    "; Utils::parseItemData(VISTA_AND_ABOVE_IDLIST_PROPS.IDList[i].Data);
        }
        cout << "           TerminalID:              "; Utils::print_vec(VISTA_AND_ABOVE_IDLIST_PROPS.TerminalID);
    }
    cout << "TerminalBlock:                      "; Utils::print_vec(TerminalBlock);
    cout << "_________________________________________________________" << endl;
}